

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiInst(Fts5Context *pCtx,int iIdx,int *piPhrase,int *piCol,int *piOff)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  int rc;
  Fts5Cursor *unaff_retaddr;
  Fts5Cursor *pCsr;
  int local_34;
  
  local_34 = 0;
  if (((*(uint *)(in_RDI + 0x50) & 8) == 0) ||
     (local_34 = fts5CacheInstArray(unaff_retaddr), local_34 == 0)) {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xac) <= in_ESI)) {
      local_34 = 0x19;
    }
    else {
      *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 0xb0) + (long)(in_ESI * 3) * 4);
      *in_RCX = *(undefined4 *)(*(long *)(in_RDI + 0xb0) + (long)(in_ESI * 3 + 1) * 4);
      *in_R8 = *(undefined4 *)(*(long *)(in_RDI + 0xb0) + (long)(in_ESI * 3 + 2) * 4);
    }
  }
  return local_34;
}

Assistant:

static int fts5ApiInst(
  Fts5Context *pCtx,
  int iIdx,
  int *piPhrase,
  int *piCol,
  int *piOff
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr))
  ){
    if( iIdx<0 || iIdx>=pCsr->nInstCount ){
      rc = SQLITE_RANGE;
    }else{
      *piPhrase = pCsr->aInst[iIdx*3];
      *piCol = pCsr->aInst[iIdx*3 + 1];
      *piOff = pCsr->aInst[iIdx*3 + 2];
    }
  }
  return rc;
}